

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::FillRuleCase::iterate(FillRuleCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  TestLog *pTVar3;
  FillRuleCase *pFVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined4 extraout_var;
  size_type *psVar8;
  ulong *puVar9;
  Surface *pSVar10;
  void *__buf;
  void *__buf_00;
  char *description;
  long lVar11;
  int row;
  int iVar12;
  IterateResult IVar13;
  ulong uVar14;
  undefined8 uVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  long lVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  Random rnd;
  float local_334;
  float local_330;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_328;
  float local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  string local_2f8;
  string local_2d8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  string local_2a8;
  LogImageSet local_288;
  Surface local_248;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  string local_220;
  string local_200;
  ulong local_1e0;
  FillRuleCase *local_1d8;
  ScopedLogSection local_1d0;
  long local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar23 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar23 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0xadb332);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2a8.field_2._M_allocated_capacity = *psVar8;
    local_2a8.field_2._8_8_ = plVar5[3];
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar8;
    local_2a8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2a8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  paVar20 = &local_288.m_name.field_2;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_288.m_name.field_2._M_allocated_capacity = *puVar9;
    local_288.m_name.field_2._8_8_ = plVar5[3];
    local_288.m_name._M_dataplus._M_p = (pointer)paVar20;
  }
  else {
    local_288.m_name.field_2._M_allocated_capacity = *puVar9;
    local_288.m_name._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_288.m_name._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != paVar20) {
    uVar15 = local_288.m_name.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_288.m_name._M_string_length + local_2f8._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      uVar15 = local_2f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_288.m_name._M_string_length + local_2f8._M_string_length)
    goto LAB_0044f925;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_288.m_name._M_dataplus._M_p);
  }
  else {
LAB_0044f925:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2f8._M_dataplus._M_p);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_200.field_2._M_allocated_capacity = *psVar8;
    local_200.field_2._8_8_ = puVar6[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar8;
    local_200._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_200._M_string_length = puVar6[1];
  *puVar6 = psVar8;
  puVar6[1] = 0;
  *(undefined1 *)psVar8 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != paVar20) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1d0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_200,&local_200);
  iVar12 = 1 << (8U - (char)(this->super_BaseRenderingCase).m_pixelFormat.redBits & 0x1f);
  iVar21 = 1 << (8U - (char)(this->super_BaseRenderingCase).m_pixelFormat.greenBits & 0x1f);
  local_2ac = 1 << (8U - (char)(this->super_BaseRenderingCase).m_pixelFormat.blueBits & 0x1f);
  iVar23 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_248,iVar23,iVar23);
  local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = *(uint *)&(this->super_BaseRenderingCase).field_0xc4;
  local_2b4 = iVar12;
  local_2b0 = iVar21;
  if (uVar2 < 5) {
    iVar23 = this->m_iteration;
    if ((0x13U >> (uVar2 & 0x1f) & 1) == 0) {
      fVar24 = ((float)iVar23 / (float)(this->m_iterationCount + -1)) * 3.1415927 * 0.5;
      fVar26 = cosf(fVar24);
      fVar24 = sinf(fVar24);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_328,6);
      if (uVar2 == 3) {
        fVar30 = 0.5;
      }
      else {
        fVar30 = 0.0;
      }
      fVar24 = fVar24 * *(float *)(&DAT_00ada980 + (ulong)(uVar2 == 3) * 4);
      fVar26 = fVar26 * *(float *)(&DAT_00ada980 + (ulong)(uVar2 == 3) * 4);
      fVar28 = fVar26 + (fVar30 - fVar24);
      fVar27 = (fVar30 - fVar26) - fVar24;
      fVar29 = (fVar30 + fVar24) - fVar26;
      fVar25 = fVar30 + fVar26 + fVar24;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[0] = fVar25;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[1] = fVar29;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = (fVar30 + fVar26) - fVar24;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = fVar26 + fVar30 + fVar24;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = fVar27;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = fVar28;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = fVar27;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = fVar28;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = fVar25;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = fVar29;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = fVar24 + (fVar30 - fVar26);
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = (fVar30 - fVar24) - fVar26;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init((deRandom *)local_1b8,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_328,0x60);
      iVar23 = iVar23 << 4;
      lVar19 = 0;
      lVar22 = 0;
      lVar7 = 0;
      local_1d8 = this;
      do {
        fVar24 = ((float)(int)lVar7 + 0.5) * 0.25;
        local_224 = fVar24 + fVar24 + -1.0;
        local_1e0 = lVar7 * 4;
        lVar11 = 0;
        uVar14 = 0;
        local_1c8 = lVar7;
        local_1c0 = lVar22;
        do {
          pFVar4 = local_1d8;
          fVar24 = ((float)(int)uVar14 + 0.5) * 0.25;
          local_334 = fVar24 + fVar24 + -1.0;
          fVar24 = ((float)(iVar23 + (int)uVar14) / (float)(local_1d8->m_iterationCount << 4)) *
                   3.1415927 * 0.5;
          local_330 = cosf(fVar24);
          fVar24 = sinf(fVar24);
          local_330 = local_330 * 0.15;
          fVar24 = fVar24 * 0.15;
          local_308 = local_330 + local_334;
          local_2fc = fVar24 + local_308;
          local_308 = local_308 - fVar24;
          local_30c = local_330 + local_224 + fVar24;
          fVar26 = (local_224 + fVar24) - local_330;
          local_334 = local_334 - local_330;
          local_304 = local_334 - fVar24;
          local_300 = local_330 + (local_224 - fVar24);
          local_334 = local_334 + fVar24;
          local_330 = (local_224 - fVar24) - local_330;
          iVar12 = *(int *)&(pFVar4->super_BaseRenderingCase).field_0xc4;
          if (iVar12 == 4) {
            fVar24 = deRandom_getFloat((deRandom *)local_1b8);
            local_228 = fVar24 * 3.9 + 0.1;
            fVar24 = deRandom_getFloat((deRandom *)local_1b8);
            local_230 = fVar24 * 3.9 + 0.1;
            local_22c = deRandom_getFloat((deRandom *)local_1b8);
            fVar24 = deRandom_getFloat((deRandom *)local_1b8);
            fVar30 = local_22c * 3.9 + 0.1;
            fVar24 = fVar24 * 3.9 + 0.1;
            lVar7 = (uVar14 | local_1e0) * 6;
            *(float *)((long)(local_328.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + lVar19)
                 = local_2fc * local_228;
            *(float *)((long)(local_328.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar11 + 4 + lVar19) = fVar26 * local_228;
            *(undefined4 *)
             ((long)(local_328.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 8 + lVar19) = 0;
            *(float *)((long)(local_328.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar11 + 0xc + lVar19) = local_228;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar19 + lVar11)
                 = local_308 * local_230;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar11 + lVar19 + 4) = local_30c * local_230;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar11 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar11 + lVar19 + 0xc) = local_230;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar19 + lVar11)
                 = local_304 * fVar30;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar11 + lVar19 + 4) = local_300 * fVar30;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar11 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar11 + lVar19 + 0xc) = fVar30;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar19 + lVar11)
                 = local_304 * fVar30;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar11 + lVar19 + 4) = local_300 * fVar30;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar11 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar11 + lVar19 + 0xc) = fVar30;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar19 + lVar11)
                 = local_2fc * local_228;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar11 + lVar19 + 4) = fVar26 * local_228;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar11 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar11 + lVar19 + 0xc) = local_228;
            local_334 = local_334 * fVar24;
            local_330 = local_330 * fVar24;
LAB_0044ff99:
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7 + 5].m_data[0] = local_334;
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7 + 5].m_data[1] = local_330;
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7 + 5].m_data[2] = 0.0;
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7 + 5].m_data[3] = fVar24;
          }
          else {
            if (iVar12 == 1) {
              lVar7 = (uVar14 | local_1e0) * 6;
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + lVar19
                        ) = local_2fc;
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        lVar11 + 4 + lVar19) = fVar26;
              *(undefined8 *)
               ((long)(local_328.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 8 + lVar19) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar19 + lVar11
                        ) = local_308;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                        lVar11 + lVar19 + 4) = local_30c;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar19 + lVar11
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                        lVar11 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar19 + lVar11
                        ) = local_2fc;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                        lVar11 + lVar19 + 4) = fVar26;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar19 + lVar11
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                        lVar11 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
LAB_0044fde9:
              fVar24 = 1.0;
              goto LAB_0044ff99;
            }
            if (iVar12 == 0) {
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + lVar19
                        ) = local_2fc;
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        lVar11 + 4 + lVar19) = fVar26;
              *(undefined8 *)
               ((long)(local_328.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + 8 + lVar19) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar19 + lVar11
                        ) = local_308;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                        lVar11 + lVar19 + 4) = local_30c;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar19 + lVar11
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                        lVar11 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar19 + lVar11
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                        lVar11 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar19 + lVar11
                        ) = local_2fc;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                        lVar11 + lVar19 + 4) = fVar26;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar11 + lVar19 + 8) =
                   0x3f80000000000000;
              lVar7 = lVar22;
              goto LAB_0044fde9;
            }
          }
          uVar14 = uVar14 + 1;
          lVar22 = lVar22 + 6;
          lVar11 = lVar11 + 0x60;
        } while (lVar11 != 0x180);
        lVar7 = local_1c8 + 1;
        lVar22 = local_1c0 + 0x18;
        lVar19 = lVar19 + 0x180;
        iVar23 = iVar23 + 4;
        this = local_1d8;
      } while (lVar7 != 4);
    }
  }
  paVar20 = &local_2a8.field_2;
  iVar23 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar23);
  local_1b8._0_8_ = &DAT_3f0000003f000000;
  local_1b8._8_8_ = 0x3f8000003f000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_288,
             (long)local_328.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_328.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)local_1b8,
             (allocator_type *)&local_2a8);
  local_1b8._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
             ,0x65);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar7 + 0x5e0))(0xbe2);
  (**(code **)(lVar7 + 0x100))(0x8006);
  (**(code **)(lVar7 + 0x120))(1,1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_248,&local_328,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_288,4)
  ;
  iVar23 = local_2b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity -
                    (long)local_288.m_name._M_dataplus._M_p);
  }
  local_1b8._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying result.",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  if (local_248.m_height < 1) {
LAB_004505f4:
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No overlapping fragments detected.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    bVar16 = false;
  }
  else {
    iVar12 = 0;
    iVar21 = 0;
    bVar16 = false;
    do {
      uVar14 = (ulong)(uint)local_248.m_width;
      iVar18 = iVar12;
      if (0 < local_248.m_width) {
        do {
          uVar2 = *(uint *)((long)local_248.m_pixels.m_ptr + (long)iVar18 * 4);
          if (((local_2b4 < (int)((uVar2 & 0xff) - 0x7f)) ||
              (iVar23 < (int)((uVar2 >> 8 & 0xff) - 0x7f))) ||
             (local_2ac < (int)((uVar2 >> 0x10 & 0xff) - 0x7f))) {
            bVar16 = true;
          }
          iVar18 = iVar18 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar21 = iVar21 + 1;
      iVar12 = iVar12 + local_248.m_width;
    } while (iVar21 != local_248.m_height);
    if (!bVar16) goto LAB_004505f4;
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Overlapping fragments detected, image is not valid.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    pTVar3 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
    local_2a8._M_dataplus._M_p = (pointer)paVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Result of rendering","");
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Result of rendering","");
    tcu::LogImageSet::LogImageSet(&local_288,&local_2a8,&local_2d8);
    tcu::TestLog::startImageSet
              (pTVar3,local_288.m_name._M_dataplus._M_p,local_288.m_description._M_dataplus._M_p);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Result","");
    pSVar10 = &local_248;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_2f8,&local_220,pSVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar3,__buf,(size_t)pSVar10);
    tcu::TestLog::endImageSet(pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.m_description._M_dataplus._M_p != &local_288.m_description.field_2) {
      operator_delete(local_288.m_description._M_dataplus._M_p,
                      local_288.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
      operator_delete(local_288.m_name._M_dataplus._M_p,
                      local_288.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar20) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    this->m_allIterationsPassed = false;
    bVar16 = true;
  }
  if (*(int *)&(this->super_BaseRenderingCase).field_0xc4 == 2) {
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Searching missing fragments.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    if (0 < local_248.m_height) {
      iVar23 = 0;
      iVar12 = 0;
      bVar17 = false;
      do {
        uVar14 = (ulong)(uint)local_248.m_width;
        iVar21 = iVar23;
        if (0 < local_248.m_width) {
          do {
            uVar2 = *(uint *)((long)local_248.m_pixels.m_ptr + (long)iVar21 * 4);
            if ((((int)(uVar2 & 0xff) <= local_2b4) || ((int)(uVar2 >> 8 & 0xff) <= local_2b0)) ||
               ((int)(uVar2 >> 0x10 & 0xff) <= local_2ac)) {
              bVar17 = true;
            }
            iVar21 = iVar21 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        iVar12 = iVar12 + 1;
        iVar23 = iVar23 + local_248.m_width;
      } while (iVar12 != local_248.m_height);
      if (bVar17) {
        local_1b8._0_8_ =
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Missing fragments detected, image is not valid.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        if (!bVar16) {
          pTVar3 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
          local_2a8._M_dataplus._M_p = (pointer)paVar20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,"Result of rendering","");
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,"Result of rendering","");
          tcu::LogImageSet::LogImageSet(&local_288,&local_2a8,&local_2d8);
          tcu::TestLog::startImageSet
                    (pTVar3,local_288.m_name._M_dataplus._M_p,
                     local_288.m_description._M_dataplus._M_p);
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result","");
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Result","");
          pSVar10 = &local_248;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_2f8,&local_220,pSVar10,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar3,__buf_00,(size_t)pSVar10);
          tcu::TestLog::endImageSet(pTVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != local_188) {
            operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
          }
          if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288.m_description._M_dataplus._M_p != &local_288.m_description.field_2) {
            operator_delete(local_288.m_description._M_dataplus._M_p,
                            local_288.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
            operator_delete(local_288.m_name._M_dataplus._M_p,
                            local_288.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar20) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
        this->m_allIterationsPassed = false;
        goto LAB_00450a12;
      }
    }
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No missing fragments detected.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
LAB_00450a12:
  iVar23 = this->m_iteration + 1;
  this->m_iteration = iVar23;
  IVar13 = CONTINUE;
  if (iVar23 == this->m_iterationCount) {
    description = "Found invalid pixels";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar13 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_248);
  tcu::TestLog::endSection(local_1d0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return IVar13;
}

Assistant:

FillRuleCase::IterateResult FillRuleCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const int								thresholdRed			= 1 << (8 - getPixelFormat().redBits);
	const int								thresholdGreen			= 1 << (8 - getPixelFormat().greenBits);
	const int								thresholdBlue			= 1 << (8 - getPixelFormat().blueBits);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	bool									imageShown				= false;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		gl.enable(GL_BLEND);
		gl.blendEquation(GL_FUNC_ADD);
		gl.blendFunc(GL_ONE, GL_ONE);
		drawPrimitives(resultImage, drawBuffer, colorBuffer, GL_TRIANGLES);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_testCtx.getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
								<< tcu::TestLog::Image("Result", "Result", resultImage)
								<< tcu::TestLog::EndImageSet;

			imageShown = true;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_testCtx.getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			if (!imageShown)
			{
				m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
									<< tcu::TestLog::Image("Result", "Result", resultImage)
									<< tcu::TestLog::EndImageSet;
			}

			m_allIterationsPassed = false;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixels");

		return STOP;
	}
	else
		return CONTINUE;
}